

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O1

void __thiscall OpenMD::PairList::addPair(PairList *this,int i,int j)

{
  ulong uVar1;
  iterator iVar2;
  key_type kVar3;
  key_type local_18;
  
  if (i != j) {
    uVar1 = (ulong)(uint)j;
    if (j < i) {
      uVar1 = (ulong)(uint)i;
    }
    if (i < j) {
      j = i;
    }
    kVar3 = (key_type)((ulong)(uint)j | uVar1 << 0x20);
    local_18 = kVar3;
    iVar2 = std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)this,&local_18);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header) {
      local_18 = kVar3;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)this,&local_18);
      this->modified_ = true;
    }
  }
  return;
}

Assistant:

void PairList::addPair(int i, int j) {
    if (i == j) {
      return;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));

    if (iter == pairSet_.end()) {
      pairSet_.insert(std::make_pair(i, j));
      modified_ = true;
    }
  }